

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.hh
# Opt level: O2

Roaring * __thiscall roaring::Roaring::operator=(Roaring *this,Roaring *r)

{
  _Bool _Var1;
  runtime_error *this_00;
  
  _Var1 = roaring_bitmap_overwrite((roaring_bitmap_t *)this,(roaring_bitmap_t *)r);
  if (_Var1) {
    (this->roaring).high_low_container.flags =
         (this->roaring).high_low_container.flags & 0xfe | (r->roaring).high_low_container.flags & 1
    ;
    return this;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"failed memory alloc in assignment");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Roaring &operator=(const Roaring &r) {
        if (!api::roaring_bitmap_overwrite(&roaring, &r.roaring)) {
            ROARING_TERMINATE("failed memory alloc in assignment");
        }
        api::roaring_bitmap_set_copy_on_write(
            &roaring, api::roaring_bitmap_get_copy_on_write(&r.roaring));
        return *this;
    }